

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O2

CategoryFilter __thiscall
QLoggingRegistry::installFilter(QLoggingRegistry *this,CategoryFilter filter)

{
  CategoryFilter p_Var1;
  code *pcVar2;
  
  QBasicMutex::lock((QBasicMutex *)this);
  pcVar2 = defaultCategoryFilter;
  if (filter != (CategoryFilter)0x0) {
    pcVar2 = filter;
  }
  p_Var1 = this->categoryFilter;
  this->categoryFilter = pcVar2;
  updateRules(this);
  QBasicMutex::unlock((QBasicMutex *)this);
  return p_Var1;
}

Assistant:

QLoggingCategory::CategoryFilter
QLoggingRegistry::installFilter(QLoggingCategory::CategoryFilter filter)
{
    const auto locker = qt_scoped_lock(registryMutex);

    if (!filter)
        filter = defaultCategoryFilter;

    QLoggingCategory::CategoryFilter old = categoryFilter;
    categoryFilter = filter;

    updateRules();

    return old;
}